

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udpbitdht.cc
# Opt level: O0

void __thiscall
UdpBitDht::ConnectionAuth
          (UdpBitDht *this,bdId *srcId,bdId *proxyId,bdId *destId,uint32_t mode,uint32_t loc,
          uint32_t bandwidth,uint32_t delay,uint32_t answer)

{
  bdStackMutex local_48;
  bdStackMutex stack;
  uint32_t loc_local;
  uint32_t mode_local;
  bdId *destId_local;
  bdId *proxyId_local;
  bdId *srcId_local;
  UdpBitDht *this_local;
  
  stack.mMtx._0_4_ = loc;
  stack.mMtx._4_4_ = mode;
  bdStackMutex::bdStackMutex(&local_48,&this->dhtMtx);
  (*(this->mBitDhtManager->super_bdNode).super_bdNodePublisher._vptr_bdNodePublisher[0x14])
            (this->mBitDhtManager,srcId,proxyId,destId,(ulong)stack.mMtx._4_4_,
             (ulong)(uint32_t)stack.mMtx,bandwidth,delay,answer);
  bdStackMutex::~bdStackMutex(&local_48);
  return;
}

Assistant:

void UdpBitDht::ConnectionAuth(bdId *srcId, bdId *proxyId, bdId *destId, uint32_t mode, uint32_t loc, 
								uint32_t bandwidth, uint32_t delay, uint32_t answer) {
	bdStackMutex stack(dhtMtx); /********** MUTEX LOCKED *************/

	mBitDhtManager->ConnectionAuth(srcId, proxyId, destId, mode, loc, bandwidth, delay, answer);
}